

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void __thiscall
google::protobuf::OneofDescriptorProto::MergeFrom(OneofDescriptorProto *this,Message *from)

{
  LogMessage *other;
  OneofDescriptorProto *from_00;
  LogFinisher local_51;
  LogMessage local_50;
  
  if ((OneofDescriptorProto *)from == this) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.cc"
               ,0x167d);
    other = internal::LogMessage::operator<<(&local_50,"CHECK failed: (&from) != (this): ");
    internal::LogFinisher::operator=(&local_51,other);
    internal::LogMessage::~LogMessage(&local_50);
  }
  from_00 = (OneofDescriptorProto *)__dynamic_cast(from,&Message::typeinfo,&typeinfo,0);
  if (from_00 == (OneofDescriptorProto *)0x0) {
    internal::ReflectionOps::Merge(from,&this->super_Message);
  }
  else {
    MergeFrom(this,from_00);
  }
  return;
}

Assistant:

void OneofDescriptorProto::MergeFrom(const ::google::protobuf::Message& from) {
// @@protoc_insertion_point(generalized_merge_from_start:google.protobuf.OneofDescriptorProto)
  GOOGLE_DCHECK_NE(&from, this);
  const OneofDescriptorProto* source =
      ::google::protobuf::internal::DynamicCastToGenerated<const OneofDescriptorProto>(
          &from);
  if (source == NULL) {
  // @@protoc_insertion_point(generalized_merge_from_cast_fail:google.protobuf.OneofDescriptorProto)
    ::google::protobuf::internal::ReflectionOps::Merge(from, this);
  } else {
  // @@protoc_insertion_point(generalized_merge_from_cast_success:google.protobuf.OneofDescriptorProto)
    MergeFrom(*source);
  }
}